

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

EVmaster INT_EVmaster_create(CManager cm)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  EVmaster client_data;
  pthread_t pVar3;
  attr_list p_Var4;
  char *pcVar5;
  CMFormat p_Var6;
  timespec ts;
  
  client_data = (EVmaster)INT_CMmalloc(0x60);
  client_data->node_join_handler = (EVmasterJoinHandlerFunc)0x0;
  client_data->node_fail_handler = (EVmasterFailHandlerFunc)0x0;
  client_data->node_reconfig_handler = (EVmasterReconfigHandlerFunc)0x0;
  client_data->queued_messages = (EVmaster_msg_ptr)0x0;
  client_data->dfg = (EVdfg)0x0;
  client_data->state = DFG_Joining;
  client_data->node_count = 0;
  client_data->nodes = (EVint_node_list)0x0;
  client_data->client = (EVclient)0x0;
  client_data->my_contact_str = (char *)0x0;
  client_data->cm = cm;
  client_data->reconfig = 0;
  client_data->old_node_count = 1;
  client_data->sig_reconfig_bool = 0;
  client_data->no_deployment = 0;
  iVar1 = CMtrace_val[0xd];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,EVdfgVerbose);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)cm->CMTrace_file;
      _Var2 = getpid();
      pVar3 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"EVDFG initialization -  master DFG state set to %s\n",
            str_state[client_data->state]);
  }
  fflush((FILE *)cm->CMTrace_file);
  p_Var4 = INT_CMget_contact_list(cm);
  pcVar5 = (char *)attr_list_to_string(p_Var4);
  client_data->my_contact_str = pcVar5;
  free_attr_list(p_Var4);
  INT_CMregister_format(cm,EVdfg_ready_format_list);
  INT_CMregister_format(cm,EVdfg_deploy_format_list);
  INT_CMregister_format(cm,EVclient_shutdown_format_list);
  p_Var6 = INT_CMregister_format(cm,EVdfg_node_join_format_list);
  INT_CMregister_handler(p_Var6,dfg_master_msg_handler,client_data);
  p_Var6 = INT_CMregister_format(cm,EVdfg_deploy_ack_format_list);
  INT_CMregister_handler(p_Var6,dfg_master_msg_handler,(void *)((ulong)client_data | 1));
  p_Var6 = INT_CMregister_format(cm,EVclient_shutdown_contribution_format_list);
  INT_CMregister_handler(p_Var6,dfg_master_msg_handler,(void *)((ulong)client_data | 2));
  p_Var6 = INT_CMregister_format(cm,EVdfg_conn_shutdown_format_list);
  INT_CMregister_handler(p_Var6,dfg_master_msg_handler,(void *)((ulong)client_data | 3));
  p_Var6 = INT_CMregister_format(cm,EVdfg_flush_attrs_reconfig_format_list);
  INT_CMregister_handler(p_Var6,dfg_master_msg_handler,(void *)((ulong)client_data | 4));
  INT_CMadd_poll(cm,handle_queued_messages_lock,client_data);
  INT_CMadd_shutdown_task(cm,free_master,client_data,2);
  return client_data;
}

Assistant:

extern EVmaster
INT_EVmaster_create(CManager cm)
{
    EVmaster master = malloc(sizeof(struct _EVmaster));
    attr_list contact_list;

    memset(master, 0, sizeof(struct _EVmaster));
    master->cm = cm;
    master->reconfig = 0;
    master->sig_reconfig_bool = 0;
    master->old_node_count = 1;
    master->no_deployment = 0;
    master->state = DFG_Joining;

    CMtrace_out(cm, EVdfgVerbose, "EVDFG initialization -  master DFG state set to %s\n", str_state[master->state]);
    contact_list = INT_CMget_contact_list(cm);
    master->my_contact_str = attr_list_to_string(contact_list);
    free_attr_list(contact_list);

    /*
     * EVdfg master-sent messages
     */
    INT_CMregister_format(cm, EVdfg_ready_format_list);
    INT_CMregister_format(cm, EVdfg_deploy_format_list);
    INT_CMregister_format(cm, EVclient_shutdown_format_list);

    /*
     * EVdfg master-handled messages
     */
    INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_node_join_format_list),
			   dfg_master_msg_handler, (void*)(((uintptr_t)master)|DFGnode_join));
    INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_deploy_ack_format_list),
			   dfg_master_msg_handler, (void*)(((uintptr_t)master)|DFGdeploy_ack));
    INT_CMregister_handler(INT_CMregister_format(cm, EVclient_shutdown_contribution_format_list),
			   dfg_master_msg_handler, (void*)(((uintptr_t)master)|DFGshutdown_contrib));
    INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_conn_shutdown_format_list),
			   dfg_master_msg_handler, (void*)(((uintptr_t)master)|DFGconn_shutdown));
    INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_flush_attrs_reconfig_format_list),
			   dfg_master_msg_handler, (void*)(((uintptr_t)master)|DFGflush_reconfig));

    INT_CMadd_poll(cm, handle_queued_messages_lock, master);
    INT_CMadd_shutdown_task(cm, free_master, master, FREE_TASK);
    return master;
}